

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

int __thiscall
chrono::ChFunction::FilePostscriptPlot
          (ChFunction *this,ChFile_ps *m_file,int plotY,int plotDY,int plotDDY)

{
  double dVar1;
  Scalar *pSVar2;
  long lVar3;
  double dVar4;
  int mresol;
  double local_b8;
  double local_b0;
  double local_a8;
  ChArray<> xf;
  ChArray<> yf;
  double local_68;
  ChVector2<double> local_58;
  ChVector2<double> local_40;
  
  mresol = 800;
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<int>(&yf,&mresol);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<int>(&xf,&mresol);
  local_58.m_data[0] = (m_file->G_p).m_data[0];
  local_58.m_data[1] = (m_file->G_p).m_data[1];
  ChFile_ps::To_graph_from_page(m_file,&local_58);
  local_40.m_data[1] = (m_file->G_p).m_data[1];
  local_b0 = local_68;
  local_40.m_data[0] = (m_file->G_p).m_data[0] + (m_file->Gs_p).m_data[0];
  ChFile_ps::To_graph_from_page(m_file,&local_40);
  if (plotY != 0) {
    dVar1 = local_68 - local_b0;
    dVar4 = local_b0;
    for (lVar3 = 0; lVar3 < mresol; lVar3 = lVar3 + 1) {
      local_b8 = dVar4;
      (*this->_vptr_ChFunction[4])(this);
      local_a8 = dVar4;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&xf,lVar3);
      *pSVar2 = local_b8;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&yf,lVar3);
      *pSVar2 = local_a8;
      dVar4 = local_b8 + dVar1 / ((double)mresol + -1.0);
    }
    ChFile_ps::DrawGraphXY(m_file,&yf,&xf);
  }
  if (plotDY != 0) {
    dVar1 = local_68 - local_b0;
    dVar4 = local_b0;
    for (lVar3 = 0; lVar3 < mresol; lVar3 = lVar3 + 1) {
      local_b8 = dVar4;
      (*this->_vptr_ChFunction[5])(this);
      local_a8 = dVar4;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&xf,lVar3);
      *pSVar2 = local_b8;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&yf,lVar3);
      *pSVar2 = local_a8;
      dVar4 = local_b8 + dVar1 / ((double)mresol + -1.0);
    }
    ChFile_ps::DrawGraphXY(m_file,&yf,&xf);
  }
  if (plotDDY != 0) {
    local_a8 = local_68 - local_b0;
    for (lVar3 = 0; lVar3 < mresol; lVar3 = lVar3 + 1) {
      dVar4 = local_b0;
      (*this->_vptr_ChFunction[6])(this);
      local_b8 = dVar4;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&xf,lVar3);
      *pSVar2 = local_b0;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&yf,lVar3);
      *pSVar2 = local_b8;
      local_b0 = local_b0 + local_a8 / ((double)mresol + -1.0);
    }
    ChFile_ps::DrawGraphXY(m_file,&yf,&xf);
  }
  Eigen::internal::handmade_aligned_free
            (xf.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (yf.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return 1;
}

Assistant:

int ChFunction::FilePostscriptPlot(ChFile_ps* m_file, int plotY, int plotDY, int plotDDY) {
    int mresol = 800;
    ChArray<> yf(mresol);
    ChArray<> xf(mresol);
    double mx, xmin, xmax;
    ChVector2<> mp;

    // xmin
    mp = m_file->Get_G_p();
    mp = m_file->To_graph_from_page(mp);
    xmin = mp.x();
    // xmax
    mp = m_file->Get_G_p();
    mp.x() = mp.x() + m_file->Get_Gs_p().x();
    mp = m_file->To_graph_from_page(mp);
    xmax = mp.x();

    if (plotY) {
        mx = xmin;
        for (int j = 0; j < mresol; j++) {
            mp.x() = mx;
            mp.y() = this->Get_y(mx);
            xf(j) = mp.x();
            yf(j) = mp.y();
            mx += ((xmax - xmin) / ((double)mresol - 1.0));
        }
        m_file->DrawGraphXY(yf, xf);
    }
    if (plotDY) {
        mx = xmin;
        for (int j = 0; j < mresol; j++) {
            mp.x() = mx;
            mp.y() = this->Get_y_dx(mx);
            xf(j) = mp.x();
            yf(j) = mp.y();
            mx += ((xmax - xmin) / ((double)mresol - 1.0));
        }
        m_file->DrawGraphXY(yf, xf);
    }
    if (plotDDY) {
        mx = xmin;
        for (int j = 0; j < mresol; j++) {
            mp.x() = mx;
            mp.y() = this->Get_y_dxdx(mx);
            xf(j) = mp.x();
            yf(j) = mp.y();
            mx += ((xmax - xmin) / ((double)mresol - 1.0));
        }
        m_file->DrawGraphXY(yf, xf);
    }
    return 1;
}